

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools_convert.cpp
# Opt level: O2

void __thiscall
BamTools::ConvertTool::ConvertToolPrivate::PrintJson(ConvertToolPrivate *this,BamAlignment *a)

{
  long lVar1;
  char cVar2;
  pointer pCVar3;
  pointer pCVar4;
  ulong uVar5;
  ConvertToolPrivate *pCVar6;
  bool bVar7;
  ostream *poVar8;
  char *pcVar9;
  char *pcVar10;
  size_t sVar11;
  ostream *poVar12;
  BadDataException *pBVar13;
  uint uVar14;
  CigarOp *op;
  pointer pCVar15;
  BamAlignment *pBVar16;
  ulong uVar17;
  allocator local_81;
  BamAlignment *local_80;
  string local_78;
  ConvertToolPrivate *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  poVar12 = &this->m_out;
  poVar8 = std::operator<<(poVar12,"{\"name\":\"");
  poVar8 = std::operator<<(poVar8,(string *)a);
  poVar8 = std::operator<<(poVar8,"\",\"alignmentFlag\":\"");
  poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
  std::operator<<(poVar8,"\",");
  if ((-1 < a->RefID) &&
     (a->RefID <
      (int)(((long)(this->m_references).
                   super__Vector_base<BamTools::RefData,_std::allocator<BamTools::RefData>_>._M_impl
                   .super__Vector_impl_data._M_finish -
            (long)(this->m_references).
                  super__Vector_base<BamTools::RefData,_std::allocator<BamTools::RefData>_>._M_impl.
                  super__Vector_impl_data._M_start) / 0x28))) {
    poVar8 = std::operator<<(poVar12,"\"reference\":\"");
    poVar8 = std::operator<<(poVar8,(string *)
                                    ((this->m_references).
                                     super__Vector_base<BamTools::RefData,_std::allocator<BamTools::RefData>_>
                                     ._M_impl.super__Vector_impl_data._M_start + a->RefID));
    std::operator<<(poVar8,"\",");
  }
  poVar8 = std::operator<<(poVar12,"\"position\":");
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,a->Position + 1);
  poVar8 = std::operator<<(poVar8,",\"mapQuality\":");
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,a->MapQuality);
  std::operator<<(poVar8,',');
  local_80 = a;
  local_58 = this;
  if ((a->CigarData).super__Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      (a->CigarData).super__Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    std::operator<<(poVar12,"\"cigar\":[");
    pCVar4 = (a->CigarData).
             super__Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pCVar3 = (a->CigarData).
             super__Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>._M_impl.
             super__Vector_impl_data._M_start;
    for (pCVar15 = pCVar3; pCVar15 != pCVar4; pCVar15 = pCVar15 + 1) {
      if (pCVar15 != pCVar3) {
        std::operator<<(poVar12,',');
      }
      poVar8 = std::operator<<(poVar12,'\"');
      poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
      poVar8 = std::operator<<(poVar8,pCVar15->Type);
      std::operator<<(poVar8,'\"');
    }
    std::operator<<(poVar12,"],");
  }
  pCVar6 = local_58;
  pBVar16 = local_80;
  bVar7 = BamAlignment::IsPaired(local_80);
  if (((bVar7) && (-1 < pBVar16->MateRefID)) &&
     (pBVar16->MateRefID <
      (int)(((long)(pCVar6->m_references).
                   super__Vector_base<BamTools::RefData,_std::allocator<BamTools::RefData>_>._M_impl
                   .super__Vector_impl_data._M_finish -
            (long)(pCVar6->m_references).
                  super__Vector_base<BamTools::RefData,_std::allocator<BamTools::RefData>_>._M_impl.
                  super__Vector_impl_data._M_start) / 0x28))) {
    poVar8 = std::operator<<(poVar12,"\"mate\":{");
    poVar8 = std::operator<<(poVar8,"\"reference\":\"");
    poVar8 = std::operator<<(poVar8,(string *)
                                    ((pCVar6->m_references).
                                     super__Vector_base<BamTools::RefData,_std::allocator<BamTools::RefData>_>
                                     ._M_impl.super__Vector_impl_data._M_start + pBVar16->MateRefID)
                            );
    poVar8 = std::operator<<(poVar8,"\",");
    poVar8 = std::operator<<(poVar8,"\"position\":");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,pBVar16->MatePosition + 1);
    poVar8 = std::operator<<(poVar8,",\"insertSize\":");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,pBVar16->InsertSize);
    std::operator<<(poVar8,"},");
  }
  if ((pBVar16->QueryBases)._M_string_length != 0) {
    poVar8 = std::operator<<(poVar12,"\"queryBases\":\"");
    poVar8 = std::operator<<(poVar8,(string *)&pBVar16->QueryBases);
    std::operator<<(poVar8,"\",");
  }
  if ((pBVar16->Qualities)._M_string_length != 0) {
    pcVar9 = (char *)std::__cxx11::string::at((ulong)&pBVar16->Qualities);
    if (*pcVar9 != -1) {
      pcVar9 = (pBVar16->Qualities)._M_dataplus._M_p;
      poVar8 = std::operator<<(poVar12,"\"qualities\":[");
      while( true ) {
        std::ostream::operator<<(poVar8,*pcVar9 + -0x21);
        if (pcVar9 + 1 ==
            (local_80->Qualities)._M_dataplus._M_p + (local_80->Qualities)._M_string_length) break;
        poVar8 = std::operator<<(poVar12,',');
        pcVar9 = pcVar9 + 1;
      }
      std::operator<<(poVar12,"],");
      pBVar16 = local_80;
    }
  }
  poVar8 = std::operator<<(poVar12,"\"filename\":\"");
  poVar8 = std::operator<<(poVar8,(string *)&pBVar16->Filename);
  std::operator<<(poVar8,"\",");
  uVar5 = (pBVar16->TagData)._M_string_length;
  if (uVar5 != 0) {
    pcVar9 = (pBVar16->TagData)._M_dataplus._M_p;
    local_80 = (BamAlignment *)&pBVar16->TagData;
    std::operator<<(poVar12,"\"tags\":{");
    uVar17 = 0;
LAB_0010ea5e:
    if (uVar5 - uVar17 < 4) {
      pBVar13 = (BadDataException *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string((string *)&local_78,"Incomplete tag data",(allocator *)&local_50)
      ;
      BadDataException::BadDataException(pBVar13,&local_78);
      __cxa_throw(pBVar13,&BadDataException::typeinfo,BadDataException::~BadDataException);
    }
    if (uVar17 != 0) {
      std::operator<<(poVar12,',');
    }
    poVar8 = std::operator<<(poVar12,'\"');
    std::__cxx11::string::substr((ulong)&local_78,(ulong)local_80);
    poVar8 = std::operator<<(poVar8,(string *)&local_78);
    std::operator<<(poVar8,"\":");
    std::__cxx11::string::~string((string *)&local_78);
    pcVar10 = (char *)std::__cxx11::string::at((ulong)local_80);
    cVar2 = *pcVar10;
    lVar1 = uVar17 + 3;
    switch(cVar2) {
    case 'A':
      poVar8 = std::operator<<(poVar12,'\"');
      poVar8 = std::operator<<(poVar8,pcVar9[uVar17 + 3]);
      std::operator<<(poVar8,'\"');
      goto LAB_0010ec79;
    case 'B':
      std::operator<<(poVar12,'[');
      sVar11 = PrintBArrayValues(local_58,pcVar9 + lVar1,uVar5 - lVar1);
      uVar17 = sVar11 + lVar1;
      cVar2 = ']';
      goto LAB_0010ec19;
    case 'C':
      uVar14 = (uint)(byte)pcVar9[uVar17 + 3];
LAB_0010ec71:
      std::ostream::operator<<(poVar12,uVar14);
LAB_0010ec79:
      uVar17 = uVar17 + 4;
      break;
    case 'D':
    case 'E':
    case 'F':
    case 'G':
switchD_0010eb50_caseD_44:
      pBVar13 = (BadDataException *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string((string *)&local_50,"Unknown tag type: ",&local_81);
      std::operator+(&local_78,&local_50,*pcVar9);
      BadDataException::BadDataException(pBVar13,&local_78);
      __cxa_throw(pBVar13,&BadDataException::typeinfo,BadDataException::~BadDataException);
    case 'H':
switchD_0010eb50_caseD_48:
      std::operator<<(poVar12,'\"');
      uVar17 = uVar17 + 4;
      do {
        cVar2 = pcVar9[uVar17 - 1];
        if (cVar2 == '\"') {
          std::operator<<(poVar12,"\\\"");
        }
        else {
          if (cVar2 == '\0') goto LAB_0010ebb7;
          std::operator<<(poVar12,cVar2);
        }
        uVar17 = uVar17 + 1;
      } while( true );
    case 'I':
      if (uVar5 - lVar1 < 4) {
        pBVar13 = (BadDataException *)__cxa_allocate_exception(0x28);
        std::__cxx11::string::string
                  ((string *)&local_78,"Incomplete tag data",(allocator *)&local_50);
        BadDataException::BadDataException(pBVar13,&local_78);
        __cxa_throw(pBVar13,&BadDataException::typeinfo,BadDataException::~BadDataException);
      }
      std::ostream::_M_insert<unsigned_long>((ulong)poVar12);
LAB_0010eca0:
      uVar17 = uVar17 + 7;
      break;
    default:
      if (cVar2 != 'S') {
        if (cVar2 == 'Z') goto switchD_0010eb50_caseD_48;
        if (cVar2 != 'c') {
          if (cVar2 == 'f') {
            if (uVar5 - lVar1 < 4) {
              pBVar13 = (BadDataException *)__cxa_allocate_exception(0x28);
              std::__cxx11::string::string
                        ((string *)&local_78,"Incomplete tag data",(allocator *)&local_50);
              BadDataException::BadDataException(pBVar13,&local_78);
              __cxa_throw(pBVar13,&BadDataException::typeinfo,BadDataException::~BadDataException);
            }
            std::ostream::operator<<(poVar12,*(float *)(pcVar9 + uVar17 + 3));
          }
          else {
            if (cVar2 != 'i') {
              if (cVar2 != 's') goto switchD_0010eb50_caseD_44;
              if (uVar5 - lVar1 < 2) {
                pBVar13 = (BadDataException *)__cxa_allocate_exception(0x28);
                std::__cxx11::string::string
                          ((string *)&local_78,"Incomplete tag data",(allocator *)&local_50);
                BadDataException::BadDataException(pBVar13,&local_78);
                __cxa_throw(pBVar13,&BadDataException::typeinfo,BadDataException::~BadDataException)
                ;
              }
              std::ostream::operator<<(poVar12,*(short *)(pcVar9 + uVar17 + 3));
              goto LAB_0010ec44;
            }
            if (uVar5 - lVar1 < 4) {
              pBVar13 = (BadDataException *)__cxa_allocate_exception(0x28);
              std::__cxx11::string::string
                        ((string *)&local_78,"Incomplete tag data",(allocator *)&local_50);
              BadDataException::BadDataException(pBVar13,&local_78);
              __cxa_throw(pBVar13,&BadDataException::typeinfo,BadDataException::~BadDataException);
            }
            std::ostream::operator<<(poVar12,*(int *)(pcVar9 + uVar17 + 3));
          }
          goto LAB_0010eca0;
        }
        uVar14 = (uint)pcVar9[uVar17 + 3];
        goto LAB_0010ec71;
      }
      if (uVar5 - lVar1 < 2) {
        pBVar13 = (BadDataException *)__cxa_allocate_exception(0x28);
        std::__cxx11::string::string
                  ((string *)&local_78,"Incomplete tag data",(allocator *)&local_50);
        BadDataException::BadDataException(pBVar13,&local_78);
        __cxa_throw(pBVar13,&BadDataException::typeinfo,BadDataException::~BadDataException);
      }
      std::ostream::operator<<(poVar12,*(ushort *)(pcVar9 + uVar17 + 3));
LAB_0010ec44:
      uVar17 = uVar17 + 5;
    }
    goto LAB_0010eca4;
  }
LAB_0010ecc1:
  poVar12 = std::operator<<(poVar12,'}');
  std::endl<char,std::char_traits<char>>(poVar12);
  return;
LAB_0010ebb7:
  cVar2 = '\"';
LAB_0010ec19:
  std::operator<<(poVar12,cVar2);
LAB_0010eca4:
  if ((uVar5 <= uVar17) || (pcVar9[uVar17] == '\0')) goto LAB_0010ecb6;
  goto LAB_0010ea5e;
LAB_0010ecb6:
  std::operator<<(poVar12,'}');
  goto LAB_0010ecc1;
}

Assistant:

void ConvertTool::ConvertToolPrivate::PrintJson(const BamAlignment& a)
{

    // write name & alignment flag
    m_out << "{\"name\":\"" << a.Name << "\",\"alignmentFlag\":\"" << a.AlignmentFlag << "\",";

    // write reference name
    if ((a.RefID >= 0) && (a.RefID < (int)m_references.size())) {
        m_out << "\"reference\":\"" << m_references[a.RefID].RefName << "\",";
    }

    // write position & map quality
    m_out << "\"position\":" << a.Position + 1 << ",\"mapQuality\":" << a.MapQuality << ',';

    // write CIGAR
    const std::vector<CigarOp>& cigarData = a.CigarData;
    if (!cigarData.empty()) {
        m_out << "\"cigar\":[";
        std::vector<CigarOp>::const_iterator cigarBegin = cigarData.begin();
        std::vector<CigarOp>::const_iterator cigarIter = cigarBegin;
        std::vector<CigarOp>::const_iterator cigarEnd = cigarData.end();
        for (; cigarIter != cigarEnd; ++cigarIter) {
            const CigarOp& op = (*cigarIter);
            if (cigarIter != cigarBegin) {
                m_out << ',';
            }
            m_out << '"' << op.Length << op.Type << '"';
        }
        m_out << "],";
    }

    // write mate reference name, mate position, & insert size
    if (a.IsPaired() && (a.MateRefID >= 0) && (a.MateRefID < (int)m_references.size())) {
        m_out << "\"mate\":{"
              << "\"reference\":\"" << m_references[a.MateRefID].RefName << "\","
              << "\"position\":" << a.MatePosition + 1 << ",\"insertSize\":" << a.InsertSize
              << "},";
    }

    // write sequence
    if (!a.QueryBases.empty()) {
        m_out << "\"queryBases\":\"" << a.QueryBases << "\",";
    }

    // write qualities
    if (!a.Qualities.empty() && a.Qualities.at(0) != (char)0xFF) {
        std::string::const_iterator s = a.Qualities.begin();
        m_out << "\"qualities\":[" << static_cast<short>(*s) - 33;
        ++s;
        for (; s != a.Qualities.end(); ++s) {
            m_out << ',' << static_cast<short>(*s) - 33;
        }
        m_out << "],";
    }

    // write alignment's source BAM file
    m_out << "\"filename\":\"" << a.Filename << "\",";

    // write tag data
    const char* tagData = a.TagData.c_str();
    const std::size_t tagDataLength = a.TagData.length();
    std::size_t index = 0;
    if (index < tagDataLength) {

        m_out << "\"tags\":{";

        while (index < tagDataLength) {
            // Need at least four bytes for a tag:
            //    two for name
            //    one for type
            //    at least one for value
            if (tagDataLength - index < 4) {
                throw BadDataException("Incomplete tag data");
            }

            if (index > 0) {
                m_out << ',';
            }

            // write tag name
            m_out << '"' << a.TagData.substr(index, 2) << "\":";
            index += 2;

            // get data type
            char type = a.TagData.at(index);
            ++index;
            switch (type) {
                case (Constants::BAM_TAG_TYPE_ASCII):
                    m_out << '"' << tagData[index] << '"';
                    ++index;
                    break;

                case (Constants::BAM_TAG_TYPE_INT8):
                    // force value into integer-type (instead of char value)
                    m_out << int(static_cast<int8_t>(tagData[index]));
                    ++index;
                    break;

                case (Constants::BAM_TAG_TYPE_UINT8):
                    // force value into integer-type (instead of char value)
                    m_out << int(static_cast<uint8_t>(tagData[index]));
                    ++index;
                    break;

                case (Constants::BAM_TAG_TYPE_INT16):
                    if (tagDataLength - index < sizeof(int16_t)) {
                        throw BadDataException("Incomplete tag data");
                    }
                    m_out << BamTools::UnpackSignedShort(&tagData[index]);
                    index += sizeof(int16_t);
                    break;

                case (Constants::BAM_TAG_TYPE_UINT16):
                    if (tagDataLength - index < sizeof(uint16_t)) {
                        throw BadDataException("Incomplete tag data");
                    }
                    m_out << BamTools::UnpackUnsignedShort(&tagData[index]);
                    index += sizeof(uint16_t);
                    break;

                case (Constants::BAM_TAG_TYPE_INT32):
                    if (tagDataLength - index < sizeof(int32_t)) {
                        throw BadDataException("Incomplete tag data");
                    }
                    m_out << BamTools::UnpackSignedInt(&tagData[index]);
                    index += sizeof(int32_t);
                    break;

                case (Constants::BAM_TAG_TYPE_UINT32):
                    if (tagDataLength - index < sizeof(uint32_t)) {
                        throw BadDataException("Incomplete tag data");
                    }
                    m_out << BamTools::UnpackUnsignedInt(&tagData[index]);
                    index += sizeof(uint32_t);
                    break;

                case (Constants::BAM_TAG_TYPE_FLOAT):
                    if (tagDataLength - index < sizeof(float)) {
                        throw BadDataException("Incomplete tag data");
                    }
                    m_out << BamTools::UnpackFloat(&tagData[index]);
                    index += sizeof(float);
                    break;

                case (Constants::BAM_TAG_TYPE_HEX):
                case (Constants::BAM_TAG_TYPE_STRING):
                    m_out << '"';
                    while (tagData[index]) {
                        if (tagData[index] == '\"') {
                            m_out << "\\\"";  // escape for json
                        } else {
                            m_out << tagData[index];
                        }
                        ++index;
                    }
                    m_out << '"';
                    ++index;
                    break;

                case (Constants::BAM_TAG_TYPE_ARRAY):
                    m_out << '[';
                    index += PrintBArrayValues(tagData + index, tagDataLength - index);
                    m_out << ']';
                    break;

                default:
                    throw BadDataException(std::string("Unknown tag type: ") + tagData[0]);
            }

            if (index >= tagDataLength || tagData[index] == '\0') {
                break;
            }
        }

        m_out << '}';
    }

    m_out << '}' << std::endl;
}